

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

void __thiscall
duckdb::ReservoirQuantileState<float>::FillReservoir
          (ReservoirQuantileState<float> *this,idx_t sample_size,float element)

{
  idx_t iVar1;
  ulong in_RSI;
  ReservoirQuantileState<float> *in_RDI;
  float in_XMM0_Da;
  float *in_stack_ffffffffffffffd8;
  
  if (in_RDI->pos < in_RSI) {
    iVar1 = in_RDI->pos;
    in_RDI->pos = iVar1 + 1;
    in_RDI->v[iVar1] = in_XMM0_Da;
    duckdb::BaseReservoirSampling::InitializeReservoirWeights((ulong)in_RDI->r_samp,in_RDI->pos);
  }
  else if (*(long *)(in_RDI->r_samp + 0x30) == *(long *)(in_RDI->r_samp + 0x48)) {
    ReplaceElement(in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void FillReservoir(idx_t sample_size, T element) {
		if (pos < sample_size) {
			v[pos++] = element;
			r_samp->InitializeReservoirWeights(pos, len);
		} else {
			D_ASSERT(r_samp->next_index_to_sample >= r_samp->num_entries_to_skip_b4_next_sample);
			if (r_samp->next_index_to_sample == r_samp->num_entries_to_skip_b4_next_sample) {
				ReplaceElement(element);
			}
		}
	}